

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::Diagnostic>::cleanup
          (SmallVectorBase<slang::Diagnostic> *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  SmallVectorBase<slang::Diagnostic> *this_local;
  
  __first = begin(this);
  __last = end(this);
  std::destroy<slang::Diagnostic*>(__first,__last);
  bVar1 = isSmall(this);
  if (!bVar1) {
    free(this->data_);
  }
  return;
}

Assistant:

void cleanup() {
        std::destroy(begin(), end());
        if (!isSmall())
            free(data_);
    }